

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

bool testing::Test::HasSameFixtureClass(void)

{
  TestInfo *pTVar1;
  TestInfo *pTVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  ostream *poVar8;
  char *__s;
  AssertHelper local_40;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  
  UnitTest::GetInstance();
  pTVar1 = (UnitTest::GetInstance::instance.impl_)->current_test_info_;
  pTVar2 = *((UnitTest::GetInstance::instance.impl_)->current_test_suite_->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar3 = (undefined1 *)pTVar2->fixture_class_id_;
  puVar4 = (undefined1 *)pTVar1->fixture_class_id_;
  if (puVar4 != puVar3) {
    pcVar6 = (pTVar2->name_)._M_dataplus._M_p;
    __s = (pTVar1->name_)._M_dataplus._M_p;
    if ((puVar3 == &internal::TypeIdHelper<testing::Test>::dummy_) ||
       (puVar4 == &internal::TypeIdHelper<testing::Test>::dummy_)) {
      pcVar7 = pcVar6;
      if (puVar3 == &internal::TypeIdHelper<testing::Test>::dummy_) {
        pcVar7 = __s;
        __s = pcVar6;
      }
      Message::Message((Message *)&local_38);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_38._M_head_impl + 0x10),
                 "All tests in the same test suite must use the same test fixture\n",0x40);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_38._M_head_impl + 0x10),
                 "class, so mixing TEST_F and TEST in the same test suite is\n",0x3b);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_38._M_head_impl + 0x10),"illegal.  In test suite ",0x18);
      pcVar6 = (pTVar1->test_suite_name_)._M_dataplus._M_p;
      poVar8 = (ostream *)(local_38._M_head_impl + 0x10);
      if (pcVar6 == (char *)0x0) {
        sVar5 = 6;
        pcVar6 = "(null)";
      }
      else {
        sVar5 = strlen(pcVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar6,sVar5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_38._M_head_impl + 0x10),",\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_38._M_head_impl + 0x10),"test ",5);
      poVar8 = (ostream *)(local_38._M_head_impl + 0x10);
      if (pcVar7 == (char *)0x0) {
        sVar5 = 6;
        pcVar7 = "(null)";
      }
      else {
        sVar5 = strlen(pcVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar7,sVar5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_38._M_head_impl + 0x10)," is defined using TEST_F but\n",0x1d);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_38._M_head_impl + 0x10),"test ",5);
      poVar8 = (ostream *)(local_38._M_head_impl + 0x10);
      if (__s == (char *)0x0) {
        sVar5 = 6;
        __s = "(null)";
      }
      else {
        sVar5 = strlen(__s);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,__s,sVar5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_38._M_head_impl + 0x10)," is defined using TEST.  You probably\n"
                 ,0x26);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_38._M_head_impl + 0x10),
                 "want to change the TEST to TEST_F or move it to another test\n",0x3d);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_38._M_head_impl + 0x10),"case.",5);
      internal::AssertHelper::AssertHelper
                (&local_40,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/googletest/googletest/src/gtest.cc"
                 ,0x9ca,"Failed");
      internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    }
    else {
      Message::Message((Message *)&local_38);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_38._M_head_impl + 0x10),
                 "All tests in the same test suite must use the same test fixture\n",0x40);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_38._M_head_impl + 0x10),"class.  However, in test suite ",0x1f);
      pcVar7 = (pTVar1->test_suite_name_)._M_dataplus._M_p;
      poVar8 = (ostream *)(local_38._M_head_impl + 0x10);
      if (pcVar7 == (char *)0x0) {
        sVar5 = 6;
        pcVar7 = "(null)";
      }
      else {
        sVar5 = strlen(pcVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar7,sVar5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_38._M_head_impl + 0x10),",\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_38._M_head_impl + 0x10),"you defined test ",0x11);
      poVar8 = (ostream *)(local_38._M_head_impl + 0x10);
      if (pcVar6 == (char *)0x0) {
        sVar5 = 6;
        pcVar6 = "(null)";
      }
      else {
        sVar5 = strlen(pcVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar6,sVar5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_38._M_head_impl + 0x10)," and test ",10);
      poVar8 = (ostream *)(local_38._M_head_impl + 0x10);
      if (__s == (char *)0x0) {
        sVar5 = 6;
        __s = "(null)";
      }
      else {
        sVar5 = strlen(__s);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,__s,sVar5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_38._M_head_impl + 0x10),"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_38._M_head_impl + 0x10),
                 "using two different test fixture classes.  This can happen if\n",0x3e);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_38._M_head_impl + 0x10),
                 "the two classes are from different namespaces or translation\n",0x3d);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_38._M_head_impl + 0x10),
                 "units and have the same name.  You should probably rename one\n",0x3e);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_38._M_head_impl + 0x10),
                 "of the classes to put the tests into different test suites.",0x3b);
      internal::AssertHelper::AssertHelper
                (&local_40,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/googletest/googletest/src/gtest.cc"
                 ,0x9d6,"Failed");
      internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    }
    internal::AssertHelper::~AssertHelper(&local_40);
    if (local_38._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
  }
  return puVar4 == puVar3;
}

Assistant:

bool Test::HasSameFixtureClass() {
  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  const TestSuite* const test_suite = impl->current_test_suite();

  // Info about the first test in the current test suite.
  const TestInfo* const first_test_info = test_suite->test_info_list()[0];
  const internal::TypeId first_fixture_id = first_test_info->fixture_class_id_;
  const char* const first_test_name = first_test_info->name();

  // Info about the current test.
  const TestInfo* const this_test_info = impl->current_test_info();
  const internal::TypeId this_fixture_id = this_test_info->fixture_class_id_;
  const char* const this_test_name = this_test_info->name();

  if (this_fixture_id != first_fixture_id) {
    // Is the first test defined using TEST?
    const bool first_is_TEST = first_fixture_id == internal::GetTestTypeId();
    // Is this test defined using TEST?
    const bool this_is_TEST = this_fixture_id == internal::GetTestTypeId();

    if (first_is_TEST || this_is_TEST) {
      // Both TEST and TEST_F appear in same test suite, which is incorrect.
      // Tell the user how to fix this.

      // Gets the name of the TEST and the name of the TEST_F.  Note
      // that first_is_TEST and this_is_TEST cannot both be true, as
      // the fixture IDs are different for the two tests.
      const char* const TEST_name =
          first_is_TEST ? first_test_name : this_test_name;
      const char* const TEST_F_name =
          first_is_TEST ? this_test_name : first_test_name;

      ADD_FAILURE()
          << "All tests in the same test suite must use the same test fixture\n"
          << "class, so mixing TEST_F and TEST in the same test suite is\n"
          << "illegal.  In test suite " << this_test_info->test_suite_name()
          << ",\n"
          << "test " << TEST_F_name << " is defined using TEST_F but\n"
          << "test " << TEST_name << " is defined using TEST.  You probably\n"
          << "want to change the TEST to TEST_F or move it to another test\n"
          << "case.";
    } else {
      // Two fixture classes with the same name appear in two different
      // namespaces, which is not allowed. Tell the user how to fix this.
      ADD_FAILURE()
          << "All tests in the same test suite must use the same test fixture\n"
          << "class.  However, in test suite "
          << this_test_info->test_suite_name() << ",\n"
          << "you defined test " << first_test_name << " and test "
          << this_test_name << "\n"
          << "using two different test fixture classes.  This can happen if\n"
          << "the two classes are from different namespaces or translation\n"
          << "units and have the same name.  You should probably rename one\n"
          << "of the classes to put the tests into different test suites.";
    }
    return false;
  }

  return true;
}